

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::GPBGenericValueFieldName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  LogMessage *pLVar4;
  LogMessage local_48;
  Voidify local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"valueMessage",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(local_18);
    switch(CVar2) {
    case CPPTYPE_INT32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueInt32",local_2d);
      std::allocator<char>::~allocator(local_2d);
      break;
    case CPPTYPE_INT64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueInt64",&local_2f);
      std::allocator<char>::~allocator(&local_2f);
      break;
    case CPPTYPE_UINT32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueUInt32",&local_2e);
      std::allocator<char>::~allocator(&local_2e);
      break;
    case CPPTYPE_UINT64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueUInt64",&local_30);
      std::allocator<char>::~allocator(&local_30);
      break;
    case CPPTYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueDouble",&local_32);
      std::allocator<char>::~allocator(&local_32);
      break;
    case CPPTYPE_FLOAT:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueFloat",&local_31);
      std::allocator<char>::~allocator(&local_31);
      break;
    case CPPTYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueBool",&local_33);
      std::allocator<char>::~allocator(&local_33);
      break;
    case CPPTYPE_ENUM:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueEnum",&local_36);
      std::allocator<char>::~allocator(&local_36);
      break;
    case CPPTYPE_STRING:
      TVar3 = FieldDescriptor::type(local_18);
      if (TVar3 == TYPE_BYTES) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"valueData",&local_34);
        std::allocator<char>::~allocator(&local_34);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"valueString",&local_35);
        std::allocator<char>::~allocator(&local_35);
      }
      break;
    case CPPTYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"valueMessage",&local_37);
      std::allocator<char>::~allocator(&local_37);
      break;
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
                 ,0xe8);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [16])"Can\'t get here.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_38,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GPBGenericValueFieldName(const FieldDescriptor* field) {
  // Returns the field within the GPBGenericValue union to use for the given
  // field.
  if (field->is_repeated()) {
    return "valueMessage";
  }
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return "valueInt32";
    case FieldDescriptor::CPPTYPE_UINT32:
      return "valueUInt32";
    case FieldDescriptor::CPPTYPE_INT64:
      return "valueInt64";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "valueUInt64";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "valueFloat";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "valueDouble";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "valueBool";
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        return "valueData";
      } else {
        return "valueString";
      }
    case FieldDescriptor::CPPTYPE_ENUM:
      return "valueEnum";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "valueMessage";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  ABSL_LOG(FATAL) << "Can't get here.";
  return std::string();
}